

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O0

int add_sub_mpi(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *B,int flip_B)

{
  short sVar1;
  int iVar2;
  int iVar3;
  int in_ECX;
  mbedtls_mpi *in_RDX;
  mbedtls_mpi *in_RSI;
  mbedtls_mpi *in_RDI;
  int cmp;
  int s;
  int ret;
  undefined4 in_stack_ffffffffffffffe0;
  
  sVar1 = in_RSI->s;
  if ((int)in_RSI->s * (int)in_RDX->s * in_ECX < 0) {
    iVar2 = mbedtls_mpi_cmp_abs(in_RSI,in_RDX);
    if (iVar2 < 0) {
      iVar3 = mbedtls_mpi_sub_abs(in_RSI,in_RDX,
                                  (mbedtls_mpi *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
      if (iVar3 == 0) {
        in_RDI->s = -sVar1;
      }
    }
    else {
      iVar3 = mbedtls_mpi_sub_abs(in_RSI,in_RDX,
                                  (mbedtls_mpi *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
      if (iVar3 == 0) {
        if (iVar2 == 0) {
          sVar1 = 1;
        }
        in_RDI->s = sVar1;
      }
    }
  }
  else {
    iVar3 = mbedtls_mpi_add_abs(in_RDI,in_RSI,in_RDX);
    if (iVar3 == 0) {
      in_RDI->s = sVar1;
    }
  }
  return iVar3;
}

Assistant:

static int add_sub_mpi(mbedtls_mpi *X,
                       const mbedtls_mpi *A, const mbedtls_mpi *B,
                       int flip_B)
{
    int ret, s;

    s = A->s;
    if (A->s * B->s * flip_B < 0) {
        int cmp = mbedtls_mpi_cmp_abs(A, B);
        if (cmp >= 0) {
            MBEDTLS_MPI_CHK(mbedtls_mpi_sub_abs(X, A, B));
            /* If |A| = |B|, the result is 0 and we must set the sign bit
             * to +1 regardless of which of A or B was negative. Otherwise,
             * since |A| > |B|, the sign is the sign of A. */
            X->s = cmp == 0 ? 1 : s;
        } else {
            MBEDTLS_MPI_CHK(mbedtls_mpi_sub_abs(X, B, A));
            /* Since |A| < |B|, the sign is the opposite of A. */
            X->s = -s;
        }
    } else {
        MBEDTLS_MPI_CHK(mbedtls_mpi_add_abs(X, A, B));
        X->s = s;
    }

cleanup:

    return ret;
}